

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveReader.cpp
# Opt level: O3

EStatusCode __thiscall
CFFPrimitiveReader::ReadRealOperand
          (CFFPrimitiveReader *this,double *outValue,long *outRealValueFractalEnd)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  bool bVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  double dVar11;
  Byte nibble [2];
  byte local_83;
  byte local_82 [2];
  double local_80;
  double local_78;
  CFFPrimitiveReader *local_70;
  double *local_68;
  long *local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  *outRealValueFractalEnd = 0;
  local_80 = 1.0;
  local_78 = 0.0;
  bVar9 = false;
  local_58 = 0.0;
  uStack_50 = 0;
  dVar11 = 0.0;
  uStack_40 = 0;
  bVar8 = false;
  bVar3 = false;
  bVar2 = false;
  local_70 = this;
  local_68 = outValue;
  local_60 = outRealValueFractalEnd;
  do {
    if (local_70->mInternalState == eFailure) {
      return eFailure;
    }
    local_48 = dVar11;
    iVar4 = (*(local_70->mCFFFile->super_IByteReader)._vptr_IByteReader[2])
                      (local_70->mCFFFile,&local_83,1);
    if (CONCAT44(extraout_var,iVar4) != 1) {
      local_70->mInternalState = eFailure;
      return eFailure;
    }
    local_82[0] = local_83 >> 4;
    local_82[1] = local_83 & 0xf;
    lVar5 = *local_60;
    bVar6 = true;
    lVar7 = 0;
    dVar11 = local_48;
    do {
      while (bVar1 = local_82[lVar7], bVar1 == 0xf) {
        bVar6 = false;
        bVar10 = lVar7 != 0;
        lVar7 = 1;
        if (bVar10) goto LAB_0019f37f;
      }
      switch(bVar1) {
      case 10:
switchD_0019f2d3_caseD_a:
        bVar8 = true;
        break;
      case 0xb:
        bVar3 = true;
        break;
      case 0xc:
        bVar2 = true;
        break;
      case 0xd:
        break;
      case 0xe:
        bVar9 = true;
        break;
      default:
        if ((bVar3) || (bVar2)) {
          dVar11 = dVar11 * 10.0 + (double)bVar1;
        }
        else {
          if (bVar8) {
            local_58 = local_58 * 10.0 + (double)bVar1;
            local_80 = local_80 * 10.0;
            lVar5 = lVar5 + 1;
            *local_60 = lVar5;
            goto switchD_0019f2d3_caseD_a;
          }
          local_78 = local_78 * 10.0 + (double)bVar1;
          bVar8 = false;
        }
      }
      bVar10 = lVar7 == 0;
      lVar7 = 1;
    } while (bVar10);
  } while (bVar6);
LAB_0019f37f:
  local_58 = local_58 / local_80 + local_78;
  if ((bVar2) || (bVar3)) {
    if (bVar2) {
      dVar11 = -dVar11;
    }
    dVar11 = pow(10.0,dVar11);
    local_58 = local_58 * dVar11;
  }
  if (bVar9) {
    local_58 = -local_58;
  }
  *local_68 = local_58;
  return eSuccess;
}

Assistant:

EStatusCode CFFPrimitiveReader::ReadRealOperand(double& outValue,long& outRealValueFractalEnd)
{
	double integerPart = 0;
	double fractionPart = 0;
	double powerPart = 0;
	double result;
	bool hasNegative = false;
	bool hasFraction = false;
	bool hasPositivePower = false;
	bool hasNegativePower = false;
	bool notDone = true;
	double fractionDecimal = 1;
	outRealValueFractalEnd = 0;
	Byte buffer;
	Byte nibble[2];
	EStatusCode status = PDFHummus::eSuccess;

	do
	{
		status = ReadByte(buffer);
		if(status != PDFHummus::eSuccess)
			break;

		nibble[0] = (buffer >> 4) & 0xf;
		nibble[1] = buffer & 0xf;

		for(int i = 0; i <2; ++i)
		{
			switch(nibble[i])
			{
				case 0xa:
					hasFraction = true;
					break;
				case 0xb:
					hasPositivePower = true;
					break;
				case 0xc:
					hasNegativePower = true;
					break;
				case 0xd:
					// reserved
					break;
				case 0xe:
					hasNegative = true;
					break;
				case 0xf:
					notDone = false;
					break;
				default: // numbers
					if(hasPositivePower || hasNegativePower)
					{
						powerPart = powerPart*10 + nibble[i];
					}
					else if(hasFraction)
					{
						fractionPart = fractionPart * 10 + nibble[i];
						fractionDecimal *= 10;
						++outRealValueFractalEnd;
					}
					else
						integerPart = integerPart * 10 + nibble[i];

			}
		}
	}while(notDone);

	if(PDFHummus::eSuccess == status)
	{
		result = integerPart + fractionPart/fractionDecimal;
		if(hasNegativePower || hasPositivePower)
			result = result * pow(10,hasNegativePower ? -powerPart : powerPart);
		if(hasNegative)
			result = -1*result;
		outValue = result;
	}
	return status;
}